

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# padding_x86_avx512.cpp
# Opt level: O1

int __thiscall
ncnn::Padding_x86_avx512::forward_int8
          (Padding_x86_avx512 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  uint uVar2;
  _func_int *p_Var3;
  void *pvVar4;
  size_t sVar5;
  _func_int **pp_Var6;
  int *piVar7;
  bool bVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Option OVar13;
  undefined1 auVar14 [36];
  uint uVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  ulong uVar20;
  int iVar21;
  int iVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int iVar26;
  undefined8 *puVar27;
  int iVar28;
  undefined8 *puVar29;
  undefined8 *puVar30;
  int iVar31;
  long lVar32;
  int iVar33;
  undefined8 *puVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  int unaff_R13D;
  undefined8 *puVar38;
  ulong uVar39;
  bool bVar40;
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  Mat m;
  Mat m_1;
  ulong local_1a0;
  Mat local_188;
  ulong local_140;
  ulong local_138;
  ulong local_130;
  int local_124;
  ulong local_120;
  undefined1 local_118 [24];
  int iStack_100;
  Allocator *pAStack_f8;
  int iStack_f0;
  int iStack_ec;
  int iStack_e8;
  undefined8 uStack_e4;
  undefined1 auStack_fc [36];
  size_t local_d8;
  Option *local_c8;
  long local_c0;
  ulong local_b8;
  ulong local_b0;
  int local_a8;
  uint local_a4;
  ulong local_a0;
  size_t local_98;
  void *local_90;
  long local_88;
  ulong local_80;
  undefined1 local_78 [64];
  
  iVar17 = bottom_blob->elempack;
  if (iVar17 == 8) {
    local_120 = (ulong)(uint)bottom_blob->w;
    local_b8 = (ulong)(uint)bottom_blob->h;
    local_124 = bottom_blob->d;
    local_130 = (ulong)(uint)bottom_blob->c;
    iVar21 = bottom_blob->dims;
    local_140 = bottom_blob->elemsize;
    if (iVar21 == 1) {
      p_Var3 = this->_vptr_Padding_x86_avx512[-3];
      uVar15 = *(uint *)(&this->field_0xd8 + (long)p_Var3) + bottom_blob->w * 8 +
               *(int *)(&this->field_0xdc + (long)p_Var3);
      bVar40 = (uVar15 & 7) == 0;
      iVar26 = 1;
      if (bVar40) {
        iVar26 = 8;
      }
      bVar8 = true;
      if ((bVar40 && (*(uint *)(&this->field_0xd8 + (long)p_Var3) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var3) == 0)) {
        Mat::create(top_blob,(int)uVar15 / iVar26,(local_140 >> 3) << bVar40 * '\x03',iVar26,
                    opt->blob_allocator);
        unaff_R13D = -100;
        if (top_blob->data == (void *)0x0) {
          bVar8 = false;
        }
        else {
          bVar8 = false;
          if ((long)top_blob->c * top_blob->cstep != 0) {
            p_Var3 = this->_vptr_Padding_x86_avx512[-3];
            uVar19 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var3);
            iVar26 = *(int *)(&this->field_0xd8 + (long)p_Var3);
            iVar31 = *(int *)(&this->field_0xdc + (long)p_Var3);
            iVar28 = iVar26 + 7;
            if (-1 < iVar26) {
              iVar28 = iVar26;
            }
            iVar26 = iVar31 + 7;
            if (-1 < iVar31) {
              iVar26 = iVar31;
            }
            padding_constant_pack8_int8_sse
                      (bottom_blob,top_blob,0,0,iVar28 >> 3,iVar26 >> 3,
                       uVar19 << 0x38 | uVar19 << 0x30 | uVar19 << 0x28 |
                       uVar19 << 0x20 | uVar19 << 0x18 | uVar19 << 0x10 | uVar19 << 8 | uVar19);
            unaff_R13D = 0;
            bVar8 = false;
          }
        }
      }
      if (!bVar8) {
        return unaff_R13D;
      }
    }
    if (iVar21 == 2) {
      p_Var3 = this->_vptr_Padding_x86_avx512[-3];
      uVar15 = *(uint *)(&this->field_0xd0 + (long)p_Var3) + (int)local_b8 * 8 +
               *(int *)(&this->field_0xd4 + (long)p_Var3);
      bVar40 = (uVar15 & 7) == 0;
      iVar26 = 1;
      if (bVar40) {
        iVar26 = 8;
      }
      bVar8 = true;
      if ((bVar40 && (*(uint *)(&this->field_0xd0 + (long)p_Var3) & 7) == 0) &&
         (*(int *)(&this->field_0xe0 + (long)p_Var3) == 0)) {
        Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var3) + (int)local_120 +
                             *(int *)(&this->field_0xdc + (long)p_Var3),(int)uVar15 / iVar26,
                    (local_140 >> 3) << bVar40 * '\x03',iVar26,opt->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data == (void *)0x0) ||
           (bVar8 = false, (long)top_blob->c * top_blob->cstep == 0)) {
          bVar8 = false;
        }
        else {
          p_Var3 = this->_vptr_Padding_x86_avx512[-3];
          uVar19 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var3);
          iVar26 = *(int *)(&this->field_0xd0 + (long)p_Var3);
          iVar31 = *(int *)(&this->field_0xd4 + (long)p_Var3);
          iVar28 = iVar26 + 7;
          if (-1 < iVar26) {
            iVar28 = iVar26;
          }
          iVar26 = iVar31 + 7;
          if (-1 < iVar31) {
            iVar26 = iVar31;
          }
          padding_constant_pack8_int8_sse
                    (bottom_blob,top_blob,iVar28 >> 3,iVar26 >> 3,
                     *(int *)(&this->field_0xd8 + (long)p_Var3),
                     *(int *)(&this->field_0xdc + (long)p_Var3),
                     uVar19 << 0x38 | uVar19 << 0x30 | uVar19 << 0x28 |
                     uVar19 << 0x20 | uVar19 << 0x18 | uVar19 << 0x10 | uVar19 << 8 | uVar19);
          unaff_R13D = 0;
        }
      }
      if (!bVar8) {
        return unaff_R13D;
      }
    }
    if (iVar21 == 3) {
      p_Var3 = this->_vptr_Padding_x86_avx512[-3];
      uVar15 = *(uint *)(&this->field_0xe8 + (long)p_Var3) + (int)local_130 * 8 +
               *(int *)(&this->field_0xec + (long)p_Var3);
      bVar40 = (uVar15 & 7) == 0;
      iVar26 = 1;
      if (bVar40) {
        iVar26 = 8;
      }
      bVar8 = true;
      local_a8 = iVar21;
      if (bVar40 && (*(uint *)(&this->field_0xe8 + (long)p_Var3) & 7) == 0) {
        if ((uVar15 == (int)local_130 * 8) || (*(int *)(&this->field_0xe0 + (long)p_Var3) == 0)) {
          iVar21 = (int)((long)(int)uVar15 / (long)iVar26);
          Mat::create(top_blob,*(int *)(&this->field_0xd8 + (long)p_Var3) + (int)local_120 +
                               *(int *)(&this->field_0xdc + (long)p_Var3),
                      *(int *)(&this->field_0xd0 + (long)p_Var3) + (int)local_b8 +
                      *(int *)(&this->field_0xd4 + (long)p_Var3),iVar21,
                      (local_140 >> 3) << bVar40 * '\x03',iVar26,opt->blob_allocator);
          unaff_R13D = -100;
          if (top_blob->data == (void *)0x0) {
            bVar8 = false;
          }
          else {
            bVar8 = false;
            if ((long)top_blob->c * top_blob->cstep != 0) {
              iVar31 = *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
              iVar28 = iVar31 + 7;
              if (-1 < iVar31) {
                iVar28 = iVar31;
              }
              if (0 < iVar21) {
                local_a4 = -(iVar28 >> 3);
                local_80 = (long)(int)uVar15 / (long)iVar26 & 0xffffffff;
                uVar19 = 0;
                auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                local_c8 = opt;
                uVar15 = local_a4;
                do {
                  OVar13 = _local_118;
                  local_1a0 = (ulong)uVar15;
                  local_188.w = top_blob->w;
                  local_188.h = top_blob->h;
                  local_188.c = top_blob->d;
                  pvVar4 = top_blob->data;
                  local_188.elemsize = top_blob->elemsize;
                  sVar5 = top_blob->cstep;
                  puVar38 = (undefined8 *)(sVar5 * uVar19 * local_188.elemsize + (long)pvVar4);
                  local_188.elempack = top_blob->elempack;
                  local_188.allocator = top_blob->allocator;
                  local_188.refcount._0_4_ = 0;
                  local_188.refcount._4_4_ = 0;
                  local_188.d = 1;
                  local_188.dims = top_blob->dims + -1;
                  local_188.cstep =
                       (local_188.elemsize * (long)local_188.h * (long)local_188.w + 0xf &
                       0xfffffffffffffff0) / local_188.elemsize;
                  if (top_blob->dims == 4) {
                    local_188.cstep = (long)local_188.h * (long)local_188.w;
                  }
                  p_Var3 = this->_vptr_Padding_x86_avx512[-3];
                  uVar18 = (ulong)*(float *)(&this->field_0xe4 + (long)p_Var3);
                  uVar16 = local_a4 + (int)uVar19;
                  local_188.data = puVar38;
                  local_138 = uVar19;
                  if ((int)uVar16 < 0 || (int)local_130 <= (int)uVar16) {
                    if (0 < local_188.c * (int)local_188.cstep) {
                      auVar42 = vpbroadcastq_avx512f();
                      auVar43 = vpbroadcastq_avx512f();
                      uVar18 = 0;
                      do {
                        auVar44 = vpbroadcastq_avx512f();
                        auVar44 = vporq_avx512f(auVar44,auVar41);
                        vpcmpuq_avx512f(auVar44,auVar42,2);
                        auVar44 = vmovdqu64_avx512f(auVar43);
                        *(undefined1 (*) [64])
                         ((long)pvVar4 + uVar18 * 8 + sVar5 * local_188.elemsize * uVar19) = auVar44
                        ;
                        uVar18 = uVar18 + 8;
                      } while ((local_188.c * (int)local_188.cstep + 7U & 0xfffffff8) != uVar18);
                    }
                  }
                  else {
                    iVar21 = bottom_blob->w;
                    lVar23 = (long)iVar21;
                    iVar26 = bottom_blob->h;
                    lVar35 = (long)iVar26;
                    local_90 = bottom_blob->data;
                    local_a0 = bottom_blob->elemsize;
                    local_98 = bottom_blob->cstep;
                    puVar27 = (undefined8 *)(uVar16 * local_98 * local_a0 + (long)local_90);
                    local_118._8_8_ = 0;
                    local_118._0_8_ = puVar27;
                    local_118._16_8_ = local_a0;
                    auStack_fc = OVar13._28_36_;
                    iStack_100 = bottom_blob->elempack;
                    pAStack_f8 = bottom_blob->allocator;
                    iStack_f0._0_1_ = true;
                    iStack_f0._1_1_ = false;
                    iStack_f0._2_1_ = false;
                    iStack_f0._3_1_ = false;
                    iStack_ec._0_1_ = (bool)(char)iVar21;
                    iStack_ec._1_1_ = (bool)(char)((uint)iVar21 >> 8);
                    iStack_ec._2_1_ = (bool)(char)((uint)iVar21 >> 0x10);
                    iStack_ec._3_1_ = (bool)(char)((uint)iVar21 >> 0x18);
                    iStack_e8 = iVar26;
                    uStack_e4._0_1_ = true;
                    uStack_e4._1_1_ = false;
                    uStack_e4._2_1_ = false;
                    uStack_e4._3_1_ = false;
                    auStack_fc._32_4_ = OVar13._60_4_;
                    uStack_e4._4_4_ = bottom_blob->d;
                    iStack_f0 = bottom_blob->dims + -1;
                    local_d8 = (local_a0 * lVar35 * lVar23 + 0xf & 0xfffffffffffffff0) / local_a0;
                    if (bottom_blob->dims == 4) {
                      local_d8 = lVar35 * lVar23;
                    }
                    if (*(int *)(&this->field_0xe0 + (long)p_Var3) == 0) {
                      padding_constant_pack8_int8_sse
                                ((Mat *)local_118,&local_188,
                                 *(int *)(&this->field_0xd0 + (long)p_Var3),
                                 *(int *)(&this->field_0xd4 + (long)p_Var3),
                                 *(int *)(&this->field_0xd8 + (long)p_Var3),
                                 *(int *)(&this->field_0xdc + (long)p_Var3),
                                 uVar18 << 0x38 | uVar18 << 0x30 | uVar18 << 0x28 |
                                 uVar18 << 0x20 | uVar18 << 0x18 | uVar18 << 0x10 | uVar18 << 8 |
                                 uVar18);
                      auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    }
                    auVar14 = auStack_fc;
                    pp_Var6 = this->_vptr_Padding_x86_avx512;
                    p_Var3 = pp_Var6[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var3) == 1) {
                      local_78._0_8_ = pp_Var6;
                      iVar31 = *(int *)(&this->field_0xd0 + (long)p_Var3);
                      iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var3);
                      iVar25 = *(int *)(&this->field_0xd8 + (long)p_Var3);
                      iVar1 = *(int *)(&this->field_0xdc + (long)p_Var3);
                      puVar29 = puVar38;
                      if (0 < iVar31) {
                        lVar32 = local_98 * local_a0 * local_1a0;
                        iVar33 = 0;
                        do {
                          iVar22 = iVar25;
                          if (0 < iVar25) {
                            do {
                              *puVar29 = *puVar27;
                              puVar29 = puVar29 + 1;
                              iVar22 = iVar22 + -1;
                            } while (iVar22 != 0);
                          }
                          puVar30 = puVar27;
                          if (0 < iVar21) {
                            lVar36 = 0;
                            lVar24 = 0;
                            do {
                              puVar29[lVar24] =
                                   *(undefined8 *)((long)local_90 + lVar24 * 8 + lVar32);
                              lVar24 = lVar24 + 1;
                              lVar36 = lVar36 + -8;
                            } while (iVar21 != (int)lVar24);
                            puVar29 = (undefined8 *)((long)puVar29 - lVar36);
                            puVar30 = (undefined8 *)((long)local_90 + (lVar32 - lVar36));
                          }
                          iVar22 = iVar1;
                          if (0 < iVar1) {
                            do {
                              *puVar29 = puVar30[-1];
                              puVar29 = puVar29 + 1;
                              iVar22 = iVar22 + -1;
                            } while (iVar22 != 0);
                          }
                          iVar33 = iVar33 + 1;
                        } while (iVar33 != iVar31);
                      }
                      puVar30 = puVar27;
                      if (0 < iVar26) {
                        iVar31 = 0;
                        do {
                          iVar33 = iVar25;
                          if (0 < iVar25) {
                            do {
                              *puVar29 = *puVar30;
                              puVar29 = puVar29 + 1;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          if (0 < iVar21) {
                            lVar24 = 0;
                            lVar32 = 0;
                            do {
                              puVar29[lVar32] = puVar30[lVar32];
                              lVar32 = lVar32 + 1;
                              lVar24 = lVar24 + -8;
                            } while (iVar21 != (int)lVar32);
                            puVar29 = (undefined8 *)((long)puVar29 - lVar24);
                            puVar30 = (undefined8 *)((long)puVar30 - lVar24);
                          }
                          iVar33 = iVar1;
                          if (0 < iVar1) {
                            do {
                              *puVar29 = puVar30[-1];
                              puVar29 = puVar29 + 1;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          iVar31 = iVar31 + 1;
                        } while (iVar31 != iVar26);
                      }
                      if (0 < iVar28) {
                        puVar30 = puVar30 + -lVar23;
                        iVar31 = 0;
                        do {
                          iVar33 = iVar25;
                          if (0 < iVar25) {
                            do {
                              *puVar29 = *puVar30;
                              puVar29 = puVar29 + 1;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          puVar34 = puVar30;
                          if (0 < iVar21) {
                            lVar24 = 0;
                            lVar32 = 0;
                            do {
                              puVar29[lVar32] = puVar30[lVar32];
                              lVar32 = lVar32 + 1;
                              lVar24 = lVar24 + -8;
                            } while (iVar21 != (int)lVar32);
                            puVar29 = (undefined8 *)((long)puVar29 - lVar24);
                            puVar34 = (undefined8 *)((long)puVar30 - lVar24);
                          }
                          iVar33 = iVar1;
                          if (0 < iVar1) {
                            do {
                              *puVar29 = puVar34[-1];
                              puVar29 = puVar29 + 1;
                              iVar33 = iVar33 + -1;
                            } while (iVar33 != 0);
                          }
                          iVar31 = iVar31 + 1;
                        } while (iVar31 != iVar28);
                      }
                    }
                    p_Var3 = pp_Var6[-3];
                    if (*(int *)(&this->field_0xe0 + (long)p_Var3) == 2) {
                      iVar31 = *(int *)(&this->field_0xd0 + (long)p_Var3);
                      iVar28 = *(int *)(&this->field_0xd4 + (long)p_Var3);
                      local_78._0_4_ = iVar28;
                      uVar16 = *(uint *)(&this->field_0xd8 + (long)p_Var3);
                      lVar32 = (long)(int)uVar16;
                      uVar19 = (ulong)uVar16;
                      uVar2 = *(uint *)(&this->field_0xdc + (long)p_Var3);
                      uVar18 = (ulong)uVar2;
                      lVar24 = (long)(iVar31 * iVar21);
                      local_b0 = CONCAT44(local_b0._4_4_,iVar31);
                      if (iVar31 < 1) {
                        puVar27 = puVar27 + lVar24;
                      }
                      else {
                        lVar37 = local_98 * local_a0 * local_1a0;
                        lVar36 = lVar37 + lVar32 * 8 + lVar24 * 8 + (long)local_90;
                        puVar27 = (undefined8 *)(lVar37 + lVar24 * 8 + (long)local_90);
                        iVar25 = 0;
                        do {
                          if (0 < (int)uVar16) {
                            lVar24 = 0;
                            do {
                              *puVar38 = *(undefined8 *)(lVar36 + lVar24 * 8);
                              puVar38 = puVar38 + 1;
                              lVar24 = lVar24 + -1;
                            } while (-lVar24 != uVar19);
                          }
                          puVar29 = puVar27;
                          if (0 < iVar21) {
                            lVar24 = 0;
                            lVar37 = 0;
                            do {
                              puVar38[lVar37] = puVar27[lVar37];
                              lVar37 = lVar37 + 1;
                              lVar24 = lVar24 + -8;
                            } while (iVar21 != (int)lVar37);
                            puVar38 = (undefined8 *)((long)puVar38 - lVar24);
                            puVar29 = (undefined8 *)((long)puVar27 - lVar24);
                          }
                          if (0 < (int)uVar2) {
                            lVar24 = 0;
                            do {
                              *puVar38 = puVar29[lVar24 + -2];
                              puVar38 = puVar38 + 1;
                              lVar24 = lVar24 + -1;
                            } while (-lVar24 != uVar18);
                          }
                          puVar27 = puVar27 + -lVar23;
                          iVar25 = iVar25 + 1;
                          lVar36 = lVar36 + lVar23 * -8;
                        } while (iVar25 != iVar31);
                      }
                      if (0 < iVar26) {
                        iVar31 = 0;
                        do {
                          if (0 < (int)uVar16) {
                            lVar24 = 0;
                            do {
                              *puVar38 = puVar27[lVar32 + lVar24];
                              puVar38 = puVar38 + 1;
                              lVar24 = lVar24 + -1;
                            } while (-lVar24 != uVar19);
                          }
                          if (0 < iVar21) {
                            lVar24 = 0;
                            lVar36 = 0;
                            do {
                              puVar38[lVar36] = puVar27[lVar36];
                              lVar36 = lVar36 + 1;
                              lVar24 = lVar24 + -8;
                            } while (iVar21 != (int)lVar36);
                            puVar38 = (undefined8 *)((long)puVar38 - lVar24);
                            puVar27 = (undefined8 *)((long)puVar27 - lVar24);
                          }
                          if (0 < (int)uVar2) {
                            lVar24 = 0;
                            do {
                              *puVar38 = puVar27[lVar24 + -2];
                              puVar38 = puVar38 + 1;
                              lVar24 = lVar24 + -1;
                            } while (-lVar24 != uVar18);
                          }
                          iVar31 = iVar31 + 1;
                        } while (iVar31 != iVar26);
                      }
                      local_88 = lVar35;
                      if (0 < iVar28) {
                        puVar29 = puVar27 + -(long)(iVar21 * 2);
                        puVar27 = puVar27 + (lVar32 - iVar21 * 2);
                        iVar26 = 0;
                        do {
                          if (0 < (int)uVar16) {
                            lVar35 = 0;
                            do {
                              *puVar38 = puVar27[lVar35];
                              puVar38 = puVar38 + 1;
                              lVar35 = lVar35 + -1;
                            } while (-lVar35 != uVar19);
                          }
                          puVar30 = puVar29;
                          if (0 < iVar21) {
                            lVar32 = 0;
                            lVar35 = 0;
                            do {
                              puVar38[lVar35] = puVar29[lVar35];
                              lVar35 = lVar35 + 1;
                              lVar32 = lVar32 + -8;
                            } while (iVar21 != (int)lVar35);
                            puVar38 = (undefined8 *)((long)puVar38 - lVar32);
                            puVar30 = (undefined8 *)((long)puVar29 - lVar32);
                          }
                          if (0 < (int)uVar2) {
                            lVar35 = 0;
                            do {
                              *puVar38 = puVar30[lVar35 + -2];
                              puVar38 = puVar38 + 1;
                              lVar35 = lVar35 + -1;
                            } while (-lVar35 != uVar18);
                          }
                          puVar29 = puVar29 + -lVar23;
                          iVar26 = iVar26 + 1;
                          puVar27 = puVar27 + -lVar23;
                        } while (iVar26 != iVar28);
                      }
                    }
                    local_d8 = 0;
                    local_118._0_12_ = SUB1612((undefined1  [16])0x0,0);
                    _local_118 = ZEXT1228(local_118._0_12_);
                    auStack_fc._32_4_ = auVar14._32_4_;
                    _local_118 = ZEXT4060(_local_118);
                    opt = local_c8;
                    local_c0 = lVar23;
                  }
                  uVar19 = local_138;
                  piVar7 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      if (local_188.allocator == (Allocator *)0x0) {
                        if ((undefined8 *)local_188.data != (undefined8 *)0x0) {
                          free(local_188.data);
                          auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        }
                      }
                      else {
                        (*(local_188.allocator)->_vptr_Allocator[3])();
                        auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      }
                    }
                  }
                  local_188.cstep = 0;
                  local_188.data = (void *)0x0;
                  local_188.refcount._0_4_ = 0;
                  local_188.refcount._4_4_ = 0;
                  local_188.elemsize = 0;
                  local_188.elempack = 0;
                  local_188.dims = 0;
                  local_188.w = 0;
                  local_188.h = 0;
                  local_188.d = 0;
                  local_188.c = 0;
                  uVar19 = uVar19 + 1;
                  uVar15 = uVar15 + 1;
                } while (uVar19 != local_80);
              }
              bVar8 = false;
              unaff_R13D = 0;
            }
          }
        }
      }
      iVar21 = local_a8;
      if (!bVar8) {
        return unaff_R13D;
      }
    }
    if (iVar21 == 4) {
      p_Var3 = this->_vptr_Padding_x86_avx512[-3];
      iVar21 = *(int *)(&this->field_0xe0 + (long)p_Var3);
      if (iVar21 == 0) {
        iVar26 = *(int *)(&this->field_0xe8 + (long)p_Var3) + local_124 +
                 *(int *)(&this->field_0xec + (long)p_Var3);
        local_138 = CONCAT44(local_138._4_4_,iVar26);
        Mat::create(top_blob,(int)local_120 + *(int *)(&this->field_0xd8 + (long)p_Var3) +
                             *(int *)(&this->field_0xdc + (long)p_Var3),
                    (int)local_b8 + *(int *)(&this->field_0xd0 + (long)p_Var3) +
                    *(int *)(&this->field_0xd4 + (long)p_Var3),iVar26,(int)local_130,local_140,8,
                    opt->blob_allocator);
        unaff_R13D = -100;
        if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
          if ((int)local_130 < 1) {
            unaff_R13D = 0;
          }
          else {
            local_140 = local_140 & 0xffffffff00000000;
            uVar18 = local_138 & 0xffffffff;
            uVar19 = 0;
            auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
            local_c8 = opt;
            do {
              if (0 < (int)local_138) {
                local_b0 = (ulong)*(float *)(&this->field_0xe4 +
                                            (long)this->_vptr_Padding_x86_avx512[-3]);
                local_b0 = local_b0 << 0x38 | local_b0 << 0x30 | local_b0 << 0x28 |
                           local_b0 << 0x20 | local_b0 << 0x18 | local_b0 << 0x10 | local_b0 << 8 |
                           local_b0;
                auVar42 = vpbroadcastq_avx512f();
                uVar39 = 0;
                local_78 = vmovdqu64_avx512f(auVar42);
                do {
                  OVar13 = _local_118;
                  local_188.w = top_blob->w;
                  local_188.elemsize = top_blob->elemsize;
                  local_188.h = top_blob->h;
                  local_188.elempack = top_blob->elempack;
                  local_188.allocator = top_blob->allocator;
                  local_188.cstep = (long)local_188.h * (long)local_188.w;
                  local_188.data =
                       (void *)((long)top_blob->data +
                               uVar39 * local_188.elemsize * local_188.cstep +
                               top_blob->cstep * uVar19 * local_188.elemsize);
                  local_188.refcount._0_4_ = 0;
                  local_188.refcount._4_4_ = 0;
                  local_188.dims = 2;
                  local_188.d = 1;
                  local_188.c = 1;
                  uVar15 = (int)uVar39 -
                           *(int *)(&this->field_0xe8 + (long)this->_vptr_Padding_x86_avx512[-3]);
                  if ((int)uVar15 < 0 || local_124 <= (int)uVar15) {
                    if (0 < (int)local_188.cstep) {
                      auVar43 = vpbroadcastq_avx512f();
                      uVar20 = 0;
                      do {
                        auVar44 = vpbroadcastq_avx512f();
                        auVar44 = vporq_avx512f(auVar44,auVar41);
                        vpcmpuq_avx512f(auVar44,auVar43,2);
                        auVar44 = vmovdqu64_avx512f(auVar42);
                        *(undefined1 (*) [64])((long)local_188.data + uVar20 * 8) = auVar44;
                        uVar20 = uVar20 + 8;
                      } while (((int)local_188.cstep + 7U & 0xfffffff8) != uVar20);
                    }
                  }
                  else {
                    iVar21 = bottom_blob->w;
                    local_118._16_8_ = bottom_blob->elemsize;
                    local_d8 = (long)bottom_blob->h * (long)iVar21;
                    local_118._8_8_ = 0;
                    local_118._0_8_ =
                         (long)bottom_blob->data +
                         local_d8 * local_118._16_8_ * (ulong)uVar15 +
                         bottom_blob->cstep * uVar19 * local_118._16_8_;
                    auStack_fc = OVar13._28_36_;
                    iStack_100 = bottom_blob->elempack;
                    pAStack_f8 = bottom_blob->allocator;
                    iStack_f0._0_1_ = true;
                    iStack_f0._1_1_ = false;
                    iStack_f0._2_1_ = false;
                    iStack_f0._3_1_ = false;
                    iStack_ec._0_1_ = (bool)(char)iVar21;
                    iStack_ec._1_1_ = (bool)(char)((uint)iVar21 >> 8);
                    iStack_ec._2_1_ = (bool)(char)((uint)iVar21 >> 0x10);
                    iStack_ec._3_1_ = (bool)(char)((uint)iVar21 >> 0x18);
                    iStack_e8 = bottom_blob->h;
                    auStack_fc._32_4_ = OVar13._60_4_;
                    uStack_e4._0_1_ = true;
                    uStack_e4._1_1_ = false;
                    uStack_e4._2_1_ = false;
                    uStack_e4._3_1_ = false;
                    uStack_e4._4_1_ = true;
                    uStack_e4._5_1_ = false;
                    uStack_e4._6_1_ = false;
                    uStack_e4._7_1_ = false;
                    p_Var3 = this->_vptr_Padding_x86_avx512[-3];
                    padding_constant_pack8_int8_sse
                              ((Mat *)local_118,&local_188,
                               *(int *)(&this->field_0xd0 + (long)p_Var3),
                               *(int *)(&this->field_0xd4 + (long)p_Var3),
                               *(int *)(&this->field_0xd8 + (long)p_Var3),
                               *(int *)(&this->field_0xdc + (long)p_Var3),local_b0);
                    auVar42 = vmovdqu64_avx512f(local_78);
                    auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                    if ((Allocator *)local_118._8_8_ != (Allocator *)0x0) {
                      LOCK();
                      *(int *)(_func_int ***)local_118._8_8_ =
                           *(int *)(_func_int ***)local_118._8_8_ + -1;
                      UNLOCK();
                      if (*(int *)(_func_int ***)local_118._8_8_ == 0) {
                        if (pAStack_f8 == (Allocator *)0x0) {
                          if ((void *)local_118._0_8_ != (void *)0x0) {
                            free((void *)local_118._0_8_);
                            auVar42 = vmovdqu64_avx512f(local_78);
                            auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                          }
                        }
                        else {
                          (*pAStack_f8->_vptr_Allocator[3])();
                          auVar42 = vmovdqu64_avx512f(local_78);
                          auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        }
                      }
                    }
                    auVar14 = auStack_fc;
                    local_d8 = 0;
                    local_118._0_12_ = SUB1612((undefined1  [16])0x0,0);
                    _local_118 = ZEXT1228(local_118._0_12_);
                    auStack_fc._32_4_ = auVar14._32_4_;
                    _local_118 = ZEXT4060(_local_118);
                  }
                  piVar7 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
                  if (piVar7 != (int *)0x0) {
                    LOCK();
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (*piVar7 == 0) {
                      if (local_188.allocator == (Allocator *)0x0) {
                        if (local_188.data != (void *)0x0) {
                          free(local_188.data);
                          auVar42 = vmovdqu64_avx512f(local_78);
                          auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                        }
                      }
                      else {
                        (*(local_188.allocator)->_vptr_Allocator[3])();
                        auVar42 = vmovdqu64_avx512f(local_78);
                        auVar41 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      }
                    }
                  }
                  uVar39 = uVar39 + 1;
                } while (uVar39 != uVar18);
              }
              uVar19 = uVar19 + 1;
            } while (uVar19 != local_130);
            unaff_R13D = 0;
            opt = local_c8;
            iVar21 = (int)local_140;
          }
        }
      }
      if (iVar21 == 0) {
        return unaff_R13D;
      }
    }
  }
  piVar7 = bottom_blob->refcount;
  local_188.data = bottom_blob->data;
  local_188.refcount._0_4_ = SUB84(bottom_blob->refcount,0);
  local_188.refcount._4_4_ = (undefined4)((ulong)bottom_blob->refcount >> 0x20);
  local_188.elemsize = bottom_blob->elemsize;
  local_188.elempack = bottom_blob->elempack;
  local_188.allocator = bottom_blob->allocator;
  uVar9 = bottom_blob->dims;
  uVar10 = bottom_blob->w;
  uVar11 = bottom_blob->h;
  uVar12 = bottom_blob->d;
  local_188.c = bottom_blob->c;
  local_188.cstep = bottom_blob->cstep;
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + 1;
    UNLOCK();
  }
  local_188.dims = uVar9;
  local_188.w = uVar10;
  local_188.h = uVar11;
  local_188.d = uVar12;
  if (iVar17 != 1) {
    auVar41 = vmovdqu64_avx512f((undefined1  [64])*opt);
    auVar41 = vmovdqu64_avx512f(auVar41);
    stack0xfffffffffffffef8 = auVar41._16_48_;
    local_118._0_8_ = auVar41._0_8_;
    local_118._8_8_ = opt->workspace_allocator;
    convert_packing(bottom_blob,&local_188,1,(Option *)local_118);
  }
  iVar17 = Padding::forward((Padding *)
                            ((long)&this->_vptr_Padding_x86_avx512 +
                            (long)this->_vptr_Padding_x86_avx512[-3]),&local_188,top_blob,opt);
  piVar7 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      if (local_188.allocator == (Allocator *)0x0) {
        if (local_188.data != (void *)0x0) {
          free(local_188.data);
        }
      }
      else {
        (*(local_188.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar17;
}

Assistant:

int Padding_x86_avx512::forward_int8(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __SSE2__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int outw = w * elempack + left + right;

            int out_elempack = outw % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (left % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, 0, 0, left / 8, right / 8, pad_value);

                return 0;
            }
        }

        if (dims == 2)
        {
            int outw = w + left + right;
            int outh = h * elempack + top + bottom;

            int out_elempack = outh % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (top % 8 == 0 && out_elempack == 8 && type == 0)
            {
                top_blob.create(outw, outh / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int64_t v8 = (int64_t)value;
                int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);
                padding_constant_pack8_int8_sse(bottom_blob, top_blob, top / 8, bottom / 8, left, right, pad_value);

                return 0;
            }
        }

        if (dims == 3)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outc = channels * elempack + front + behind;

            int out_elempack = outc % 8 == 0 ? 8 : 1;
            size_t out_elemsize = elemsize / elempack * out_elempack;

            if (front % 8 == 0 && out_elempack == 8 && !(outc != channels * elempack && type != 0))
            {
                top_blob.create(outw, outh, outc / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                int front_ = front / elempack;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < outc / out_elempack; q++)
                {
                    Mat borderm = top_blob.channel(q);

                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    //Channel padding
                    if ((q - front_) < 0 || (q - front_) >= channels)
                    {
                        borderm.fill<int64_t>(pad_value);
                    }
                    else
                    {
                        const Mat m = bottom_blob.channel(q - front_);
                        if (type == 0)
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        if (type == 1)
                            padding_replicate_pack8_int8_sse(m, borderm, top, bottom, left, right);
                        if (type == 2)
                            padding_reflect_pack8_int8_sse(m, borderm, top, bottom, left, right);
                    }
                }

                return 0;
            }
        }

        if (dims == 4)
        {
            int outw = w + left + right;
            int outh = h + top + bottom;
            int outd = d + front + behind;

            if (type == 0)
            {
                top_blob.create(outw, outh, outd, channels, elemsize, elempack, opt.blob_allocator);
                if (top_blob.empty())
                    return -100;

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    // TODO perchannel
                    //                     int64_t pad_value = per_channel_pad_data_size ? vld1_s8(per_channel_pad_data + q * 8) : vdup_n_s8((signed char)value);
                    int64_t v8 = (int64_t)value;
                    int64_t pad_value = v8 | (v8 << 8) | (v8 << 16) | (v8 << 24) | (v8 << 32) | (v8 << 40) | (v8 << 48) | (v8 << 56);

                    for (int z = 0; z < outd; z++)
                    {
                        Mat borderm = top_blob.channel(q).depth(z);

                        // depth padding
                        if ((z - front) < 0 || (z - front) >= d)
                        {
                            borderm.fill<int64_t>(pad_value);
                        }
                        else
                        {
                            const Mat m = bottom_blob.channel(q).depth(z - front);
                            padding_constant_pack8_int8_sse(m, borderm, top, bottom, left, right, pad_value);
                        }
                    }
                }

                return 0;
            }
        }
    }
#endif // __SSE2__

    Mat bottom_blob_unpacked = bottom_blob;
    if (elempack != 1)
    {
        Option opt_pack1 = opt;
        opt_pack1.blob_allocator = opt.workspace_allocator;

        convert_packing(bottom_blob, bottom_blob_unpacked, 1, opt_pack1);
    }

    return Padding::forward(bottom_blob_unpacked, top_blob, opt);
}